

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O0

void TEST_FOR_FAIL_GENERIC(char *name,char *str,char *error1,char *error2)

{
  nullres nVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  char *pcVar4;
  char *lineEnd;
  char *bufNext;
  char *pos;
  char buf [1024];
  nullres good;
  char *error2_local;
  char *error1_local;
  char *str_local;
  char *name_local;
  
  testsCount[4] = testsCount[4] + 1;
  nVar1 = nullcCompile(str);
  if (nVar1 == '\0') {
    pcVar3 = nullcGetLastError();
    pcVar3 = strstr(pcVar3,"ERROR:");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = nullcGetLastError();
      strncpy((char *)&pos,pcVar3,0x3ff);
    }
    else {
      strncpy((char *)&pos,pcVar3,0x3ff);
    }
    buf[0x3f7] = '\0';
    __n = strlen(error1);
    iVar2 = memcmp(&pos,error1,__n);
    if (iVar2 == 0) {
      pcVar3 = strstr((char *)((long)&pos + 1),"while instantiating");
      if (pcVar3 == (char *)0x0) {
        printf("Failed %s but with no second error:\nexpected:\n    %s\n",name,error2);
      }
      else {
        pcVar4 = strchr(pcVar3,10);
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
        }
        iVar2 = strcmp(error2,pcVar3);
        if (iVar2 == 0) {
          testsPassed[4] = testsPassed[4] + 1;
        }
        else {
          printf("Failed %s but for wrong reason:\n    %s\nexpected:\n    %s\n",name,pcVar3,error2);
        }
      }
    }
    else {
      printf("Failed %s but for wrong reason:\n    %s\nexpected:\n    %s\n",name,&pos,error1);
    }
  }
  else {
    printf("Test \"%s\" failed to fail.\n",name);
  }
  return;
}

Assistant:

void TEST_FOR_FAIL_GENERIC(const char* name, const char* str, const char* error1, const char* error2)
{
	testsCount[TEST_TYPE_FAILURE]++;
	nullres good = nullcCompile(str);
	if(!good)
	{
		char buf[1024];

		if(const char *pos = strstr(nullcGetLastError(), "ERROR:"))
			strncpy(buf, pos, 1023);
		else
			strncpy(buf, nullcGetLastError(), 1023);

		buf[1023] = 0;


		if(memcmp(buf, error1, strlen(error1)) != 0)
		{
			printf("Failed %s but for wrong reason:\n    %s\nexpected:\n    %s\n", name, buf, error1);
		}
		else
		{
			char *bufNext = strstr(buf + 1, "while instantiating");

			if(!bufNext)
			{
				printf("Failed %s but with no second error:\nexpected:\n    %s\n", name, error2);
			}
			else
			{
				if(char *lineEnd = strchr(bufNext, '\n'))
					*lineEnd = 0;

				if(strcmp(error2, bufNext) != 0)
				{
					printf("Failed %s but for wrong reason:\n    %s\nexpected:\n    %s\n", name, bufNext, error2);
				}
				else
				{
					testsPassed[TEST_TYPE_FAILURE]++;
				}
			}
		}
	}
	else
	{
		printf("Test \"%s\" failed to fail.\n", name);
	}
}